

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.h
# Opt level: O0

void __thiscall
lf::assemble::DynamicFEDofHandler::
DynamicFEDofHandler<projects::ipdg_stokes::assemble::createOffsetFunction(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::mesh::utils::MeshDataSet<bool>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,Eigen::SparseMatrix<double,0,int>const&)::__1>
          (DynamicFEDofHandler *this,shared_ptr<const_lf::mesh::Mesh> *mesh_p,
          anon_class_8_1_69d70da8 *locdof)

{
  Entity *pEVar1;
  glb_idx_t gVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  value_type vVar6;
  size_type sVar7;
  uint uVar8;
  element_type *peVar9;
  reference pvVar10;
  undefined4 extraout_var;
  reference pvVar11;
  reference pvVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference ppEVar13;
  reference pvVar14;
  reference pvVar15;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  reference ppEVar16;
  reference peVar17;
  uint local_8b0;
  uint local_8ac;
  uint j_6;
  int j_5;
  int j_4;
  glb_idx_t edge_int_dof_offset;
  size_type no_int_dof_edge_1;
  glb_idx_t edge_idx_1;
  undefined1 auStack_890 [4];
  int ed_sub_idx;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> edges;
  span<const_lf::mesh::Orientation,_18446744073709551615UL> edge_orientations;
  uint j_3;
  size_type no_int_dofs_vt;
  glb_idx_t vt_dof_offset;
  glb_idx_t vt_idx;
  Entity *vertex;
  iterator __end4_1;
  iterator __begin4_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range4_1;
  Entity *pEStack_828;
  size_type no_int_dof_cell;
  Entity *cell;
  glb_idx_t cell_idx;
  size_type cell_dof_offset;
  uint local_810;
  uint local_80c;
  size_type no_cells;
  uint j_2;
  uint j_1;
  size_type no_int_dofs_ep;
  glb_idx_t ep_dof_offset;
  glb_idx_t ep_idx;
  Entity *endpoint;
  iterator __end4;
  iterator __begin4;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range4;
  size_type no_int_dof_edge;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  string local_750;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  stringstream local_6e0 [8];
  stringstream ss_2;
  ostream local_6d0 [376];
  Entity *local_558;
  Entity *edge;
  value_type local_548;
  glb_idx_t edge_idx;
  size_type edge_dof_offset;
  uint local_53c;
  uint local_538;
  size_type no_edges;
  uint j;
  size_type no_int_dof_node;
  glb_idx_t node_dof_offset;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  stringstream local_448 [8];
  stringstream ss_1;
  ostream local_438 [376];
  Entity *local_2c0;
  Entity *node_p;
  glb_idx_t node_idx;
  uint local_2ac;
  value_type vStack_2a8;
  size_type no_nodes;
  gdof_idx_t dof_idx;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [392];
  anon_class_8_1_69d70da8 *local_20;
  anon_class_8_1_69d70da8 *locdof_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_p_local;
  DynamicFEDofHandler *this_local;
  
  local_20 = locdof;
  locdof_local = (anon_class_8_1_69d70da8 *)mesh_p;
  mesh_p_local = (shared_ptr<const_lf::mesh::Mesh> *)this;
  DofHandler::DofHandler(&this->super_DofHandler);
  (this->super_DofHandler)._vptr_DofHandler = (_func_int **)&PTR__DynamicFEDofHandler_00a03a10;
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr(&this->mesh_p_,mesh_p);
  this->num_dof_ = 0;
  std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::vector
            (&this->dof_entities_);
  std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::array
            (&this->num_int_dofs_);
  std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::array(&this->offsets_);
  std::array<std::vector<long,_std::allocator<long>_>,_3UL>::array(&this->dofs_);
  peVar9 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  iVar4 = (**peVar9->_vptr_Mesh)();
  if (iVar4 != 2) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(local_1a8,"Can handle 2D meshes only");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"(mesh_p_->DimMesh() == 2)",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x239,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
               ,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"",(allocator<char> *)((long)&dof_idx + 7));
    lf::base::AssertionFailed(&local_248,&local_270,0x239,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dof_idx + 7));
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    abort();
  }
  _vStack_2a8 = 0;
  peVar9 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  local_2ac = (*peVar9->_vptr_Mesh[3])(peVar9,2);
  pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                      (&this->num_int_dofs_,2);
  node_idx = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (pvVar10,(ulong)local_2ac,&node_idx);
  pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                      (&this->offsets_,2);
  node_p._4_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (pvVar10,(ulong)(local_2ac + 1),(value_type_conflict2 *)((long)&node_p + 4));
  node_p._0_4_ = 0;
  while( true ) {
    if (local_2ac <= (uint)node_p) {
      vVar6 = vStack_2a8;
      pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                operator[](&this->offsets_,2);
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar10,(ulong)local_2ac);
      *pvVar11 = vVar6;
      peVar9 = std::
               __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mesh_p_);
      local_53c = (*peVar9->_vptr_Mesh[3])(peVar9,1);
      pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                operator[](&this->num_int_dofs_,1);
      edge_dof_offset = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (pvVar10,(ulong)local_53c,&edge_dof_offset);
      pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                operator[](&this->offsets_,1);
      edge_idx = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (pvVar10,(ulong)(local_53c + 1),&edge_idx);
      local_548 = 0;
      edge._4_4_ = 0;
      while( true ) {
        vVar6 = local_548;
        if (local_53c <= edge._4_4_) {
          pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                    operator[](&this->offsets_,1);
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar10,(ulong)local_53c);
          *pvVar11 = vVar6;
          peVar9 = std::
                   __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mesh_p_);
          local_810 = (*peVar9->_vptr_Mesh[3])(peVar9,0);
          pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                    operator[](&this->num_int_dofs_,0);
          cell_dof_offset = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (pvVar10,(ulong)local_810,&cell_dof_offset);
          pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                    operator[](&this->offsets_,0);
          cell_idx = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (pvVar10,(ulong)(local_810 + 1),&cell_idx);
          cell._4_4_ = 0;
          for (cell._0_4_ = 0; vVar6 = cell._4_4_, (uint)cell < local_810;
              cell._0_4_ = (uint)cell + 1) {
            peVar9 = std::
                     __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->mesh_p_);
            iVar4 = (*peVar9->_vptr_Mesh[6])(peVar9,0,(ulong)(uint)cell);
            vVar6 = cell._4_4_;
            pEStack_828 = (Entity *)CONCAT44(extraout_var_02,iVar4);
            pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                      operator[](&this->offsets_,0);
            pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar10,(ulong)(uint)cell);
            *pvVar11 = vVar6;
            uVar5 = projects::ipdg_stokes::assemble::createOffsetFunction::anon_class_8_1_69d70da8::
                    operator()(local_20,pEStack_828);
            pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                      operator[](&this->num_int_dofs_,0);
            pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (pvVar10,(ulong)(uint)cell);
            *pvVar11 = uVar5;
            iVar4 = (*pEStack_828->_vptr_Entity[1])(pEStack_828,2);
            __begin4_1._M_current = (Entity **)CONCAT44(extraout_var_03,iVar4);
            __end4_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                                 ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                  &__begin4_1);
            vertex = (Entity *)
                     std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                               ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                &__begin4_1);
            while (bVar3 = __gnu_cxx::
                           operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                     (&__end4_1,
                                      (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                       *)&vertex), ((bVar3 ^ 0xffU) & 1) != 0) {
              ppEVar13 = __gnu_cxx::
                         __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                         ::operator*(&__end4_1);
              pEVar1 = *ppEVar13;
              peVar9 = std::
                       __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->mesh_p_);
              uVar8 = (*peVar9->_vptr_Mesh[5])(peVar9,pEVar1);
              pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                        operator[](&this->offsets_,2);
              pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (pvVar10,(ulong)uVar8);
              vVar6 = *pvVar11;
              pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                        operator[](&this->num_int_dofs_,2);
              pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (pvVar10,(ulong)uVar8);
              uVar8 = *pvVar11;
              for (edge_orientations._M_extent._M_extent_value._0_4_ = 0;
                  (uint)edge_orientations._M_extent._M_extent_value < uVar8;
                  edge_orientations._M_extent._M_extent_value._0_4_ =
                       (uint)edge_orientations._M_extent._M_extent_value + 1) {
                pvVar12 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                                    (&this->dofs_,0);
                pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                                    (&this->dofs_,2);
                pvVar15 = std::vector<long,_std::allocator<long>_>::operator[]
                                    (pvVar14,(ulong)(vVar6 + (uint)edge_orientations._M_extent.
                                                                   _M_extent_value));
                std::vector<long,_std::allocator<long>_>::push_back(pvVar12,pvVar15);
                cell._4_4_ = cell._4_4_ + 1;
              }
              __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator++(&__end4_1);
            }
            iVar4 = (*pEStack_828->_vptr_Entity[2])();
            edges._M_extent._M_extent_value = CONCAT44(extraout_var_04,iVar4);
            iVar4 = (*pEStack_828->_vptr_Entity[1])(pEStack_828,1);
            _auStack_890 = (pointer)CONCAT44(extraout_var_05,iVar4);
            edge_idx_1 = 0;
            while( true ) {
              gVar2 = edge_idx_1;
              iVar4 = (*pEStack_828->_vptr_Entity[4])();
              no_int_dof_edge_1._3_1_ = (undefined1)iVar4;
              sVar7 = lf::base::RefEl::NumSubEntities((RefEl *)((long)&no_int_dof_edge_1 + 3),1);
              if (sVar7 <= gVar2) break;
              peVar9 = std::
                       __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&this->mesh_p_);
              ppEVar16 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::
                         operator[]((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                                    auStack_890,(long)(int)edge_idx_1);
              uVar8 = (*peVar9->_vptr_Mesh[5])(peVar9,*ppEVar16);
              pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                        operator[](&this->num_int_dofs_,1);
              pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (pvVar10,(ulong)uVar8);
              local_8ac = *pvVar11;
              pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                        operator[](&this->offsets_,1);
              pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (pvVar10,(ulong)(uVar8 + 1));
              iVar4 = *pvVar11 - local_8ac;
              peVar17 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                                  ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                                   &edges._M_extent,(long)(int)edge_idx_1);
              if (*peVar17 == negative) {
                while (local_8ac = local_8ac - 1, -1 < (int)local_8ac) {
                  pvVar12 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                                      (&this->dofs_,0);
                  pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                                      (&this->dofs_,1);
                  pvVar15 = std::vector<long,_std::allocator<long>_>::operator[]
                                      (pvVar14,(ulong)(iVar4 + local_8ac));
                  std::vector<long,_std::allocator<long>_>::push_back(pvVar12,pvVar15);
                  cell._4_4_ = cell._4_4_ + 1;
                }
              }
              else if (*peVar17 == positive) {
                for (j_6 = 0; j_6 < local_8ac; j_6 = j_6 + 1) {
                  pvVar12 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                                      (&this->dofs_,0);
                  pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                                      (&this->dofs_,1);
                  pvVar15 = std::vector<long,_std::allocator<long>_>::operator[]
                                      (pvVar14,(ulong)(iVar4 + j_6));
                  std::vector<long,_std::allocator<long>_>::push_back(pvVar12,pvVar15);
                  cell._4_4_ = cell._4_4_ + 1;
                }
              }
              edge_idx_1 = edge_idx_1 + 1;
            }
            for (local_8b0 = 0; local_8b0 < uVar5; local_8b0 = local_8b0 + 1) {
              pvVar12 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                                  (&this->dofs_,0);
              std::vector<long,_std::allocator<long>_>::push_back
                        (pvVar12,(value_type_conflict6 *)&stack0xfffffffffffffd58);
              cell._4_4_ = cell._4_4_ + 1;
              std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::
              push_back(&this->dof_entities_,&stack0xfffffffffffff7d8);
              _vStack_2a8 = _vStack_2a8 + 1;
            }
          }
          pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                    operator[](&this->offsets_,0);
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar10,(ulong)local_810);
          *pvVar11 = vVar6;
          this->num_dof_ = (size_type)_vStack_2a8;
          return;
        }
        peVar9 = std::
                 __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mesh_p_);
        iVar4 = (*peVar9->_vptr_Mesh[6])(peVar9,1,(ulong)edge._4_4_);
        local_558 = (Entity *)CONCAT44(extraout_var_00,iVar4);
        peVar9 = std::
                 __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mesh_p_);
        uVar5 = (*peVar9->_vptr_Mesh[5])(peVar9,local_558);
        vVar6 = local_548;
        if (uVar5 != edge._4_4_) break;
        pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                  operator[](&this->offsets_,1);
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar10,(ulong)edge._4_4_);
        *pvVar11 = vVar6;
        vVar6 = projects::ipdg_stokes::assemble::createOffsetFunction::anon_class_8_1_69d70da8::
                operator()(local_20,local_558);
        __range4._0_4_ = vVar6;
        pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                  operator[](&this->num_int_dofs_,1);
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar10,(ulong)edge._4_4_);
        *pvVar11 = vVar6;
        iVar4 = (*local_558->_vptr_Entity[1])(local_558,1);
        __begin4._M_current = (Entity **)CONCAT44(extraout_var_01,iVar4);
        __end4 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin4
                           );
        endpoint = (Entity *)
                   std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                             ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                              &__begin4);
        while (bVar3 = __gnu_cxx::
                       operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                 (&__end4,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                           *)&endpoint), ((bVar3 ^ 0xffU) & 1) != 0) {
          ppEVar13 = __gnu_cxx::
                     __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                     ::operator*(&__end4);
          _ep_dof_offset = *ppEVar13;
          peVar9 = std::
                   __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->mesh_p_);
          no_int_dofs_ep = (*peVar9->_vptr_Mesh[5])(peVar9,_ep_dof_offset);
          pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                    operator[](&this->offsets_,2);
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar10,(ulong)no_int_dofs_ep);
          j_1 = *pvVar11;
          pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::
                    operator[](&this->num_int_dofs_,2);
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar10,(ulong)no_int_dofs_ep);
          j_2 = *pvVar11;
          for (no_cells = 0; no_cells < j_2; no_cells = no_cells + 1) {
            pvVar12 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                                (&this->dofs_,1);
            pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                                (&this->dofs_,2);
            pvVar15 = std::vector<long,_std::allocator<long>_>::operator[]
                                (pvVar14,(ulong)(j_1 + no_cells));
            std::vector<long,_std::allocator<long>_>::push_back(pvVar12,pvVar15);
            local_548 = local_548 + 1;
          }
          __gnu_cxx::
          __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
          ::operator++(&__end4);
        }
        for (local_80c = 0; local_80c < (value_type)__range4; local_80c = local_80c + 1) {
          pvVar12 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                              (&this->dofs_,1);
          std::vector<long,_std::allocator<long>_>::push_back
                    (pvVar12,(value_type_conflict6 *)&stack0xfffffffffffffd58);
          local_548 = local_548 + 1;
          std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::
          push_back(&this->dof_entities_,&local_558);
          _vStack_2a8 = _vStack_2a8 + 1;
        }
        edge._4_4_ = edge._4_4_ + 1;
      }
      std::__cxx11::stringstream::stringstream(local_6e0);
      std::operator<<(local_6d0,"Edge index mismatch");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_700,"mesh_p_->Index(*edge) == edge_idx",&local_701);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_728,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
                 ,&local_729);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_700,&local_728,0x263,&local_750);
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_728);
      std::allocator<char>::~allocator(&local_729);
      std::__cxx11::string::~string((string *)&local_700);
      std::allocator<char>::~allocator(&local_701);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"false",&local_771);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_798,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
                 ,&local_799);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&no_int_dof_edge,"",(allocator<char> *)((long)&__range4 + 7));
      lf::base::AssertionFailed(&local_770,&local_798,0x263,(string *)&no_int_dof_edge);
      std::__cxx11::string::~string((string *)&no_int_dof_edge);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
      std::__cxx11::string::~string((string *)&local_798);
      std::allocator<char>::~allocator(&local_799);
      std::__cxx11::string::~string((string *)&local_770);
      std::allocator<char>::~allocator(&local_771);
      abort();
    }
    peVar9 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
    iVar4 = (*peVar9->_vptr_Mesh[6])(peVar9,2,(ulong)(uint)node_p);
    local_2c0 = (Entity *)CONCAT44(extraout_var,iVar4);
    peVar9 = std::
             __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
    uVar5 = (*peVar9->_vptr_Mesh[5])(peVar9,local_2c0);
    if (uVar5 != (uint)node_p) break;
    vVar6 = vStack_2a8;
    j = vStack_2a8;
    pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                        (&this->offsets_,2);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (pvVar10,(ulong)(uint)node_p);
    *pvVar11 = vVar6;
    vVar6 = projects::ipdg_stokes::assemble::createOffsetFunction::anon_class_8_1_69d70da8::
            operator()(local_20,local_2c0);
    no_edges = vVar6;
    pvVar10 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL>::operator[]
                        (&this->num_int_dofs_,2);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (pvVar10,(ulong)(uint)node_p);
    *pvVar11 = vVar6;
    for (local_538 = 0; local_538 < no_edges; local_538 = local_538 + 1) {
      pvVar12 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                          (&this->dofs_,2);
      std::vector<long,_std::allocator<long>_>::push_back
                (pvVar12,(value_type_conflict6 *)&stack0xfffffffffffffd58);
      std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::push_back
                (&this->dof_entities_,&local_2c0);
      _vStack_2a8 = _vStack_2a8 + 1;
    }
    node_p._0_4_ = (uint)node_p + 1;
  }
  std::__cxx11::stringstream::stringstream(local_448);
  std::operator<<(local_438,"Node index mismatch");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"mesh_p_->Index(*node_p) == node_idx",&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
             ,&local_491);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_468,&local_490,0x247,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"false",&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
             ,&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&node_dof_offset,"",(allocator<char> *)((long)&no_int_dof_node + 3));
  lf::base::AssertionFailed(&local_4d8,&local_500,0x247,(string *)&node_dof_offset);
  std::__cxx11::string::~string((string *)&node_dof_offset);
  std::allocator<char>::~allocator((allocator<char> *)((long)&no_int_dof_node + 3));
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  abort();
}

Assistant:

DynamicFEDofHandler(std::shared_ptr<const lf::mesh::Mesh> mesh_p,
                      LOCALDOFINFO &&locdof)
      : mesh_p_(std::move(mesh_p)) {
    LF_ASSERT_MSG((mesh_p_->DimMesh() == 2), "Can handle 2D meshes only");

    // Index counter for global shape functions = global dof
    gdof_idx_t dof_idx = 0;

    // Step I: Set indices for shape functions on nodes
    // Run through node indices (entities of co-dimension 2)
    const size_type no_nodes = mesh_p_->NumEntities(2);
    num_int_dofs_[2].resize(no_nodes, 0);
    offsets_[2].resize(no_nodes + 1, 0);
    // Traverse nodes (co-dimension-2 entities) based on indices
    for (glb_idx_t node_idx = 0; node_idx < no_nodes; node_idx++) {
      // Obtain pointer to node entity
      const mesh::Entity *node_p{mesh_p_->EntityByIndex(2, node_idx)};
      LF_ASSERT_MSG(mesh_p_->Index(*node_p) == node_idx, "Node index mismatch");
      // Offset for indices of node in index vector
      const glb_idx_t node_dof_offset = dof_idx;
      offsets_[2][node_idx] = node_dof_offset;
      // Request number of local shape functions associated with the node
      const size_type no_int_dof_node = locdof(*node_p);
      num_int_dofs_[2][node_idx] = no_int_dof_node;

      // Store dof indices in array
      for (unsigned j = 0; j < no_int_dof_node; j++) {
        dofs_[2].push_back(dof_idx);
        dof_entities_.push_back(node_p);  // Store entity for current dof
        dof_idx++;                        // Move on to next index
      }
    }
    // Set sentinel
    offsets_[2][no_nodes] = dof_idx;

    // Step II: Set indices for shape functions on edges (co-dimension = 1)
    const size_type no_edges = mesh_p_->NumEntities(1);
    // Set length of edge-related index vectors
    num_int_dofs_[1].resize(no_edges, 0);
    offsets_[1].resize(no_edges + 1, 0);
    // points to the position of the current dof index
    size_type edge_dof_offset = 0;
    for (glb_idx_t edge_idx = 0; edge_idx < no_edges; edge_idx++) {
      // Obtain pointer to edge entity
      const mesh::Entity *edge{mesh_p_->EntityByIndex(1, edge_idx)};
      LF_ASSERT_MSG(mesh_p_->Index(*edge) == edge_idx, "Edge index mismatch");
      // Offset for indices of edge dof in index vector
      offsets_[1][edge_idx] = edge_dof_offset;
      const size_type no_int_dof_edge = locdof(*edge);
      num_int_dofs_[1][edge_idx] = no_int_dof_edge;

      // Obtain indices for basis functions sitting at endpoints
      // Endpoints are mesh entities with co-dimension = 2
      for (const lf::mesh::Entity *endpoint : edge->SubEntities(1)) {
        const glb_idx_t ep_idx(mesh_p_->Index(*endpoint));
        const glb_idx_t ep_dof_offset = offsets_[2][ep_idx];
        const size_type no_int_dofs_ep = num_int_dofs_[2][ep_idx];
        // Copy indices of shape functions from nodes to edge
        for (unsigned j = 0; j < no_int_dofs_ep; j++) {
          dofs_[1].push_back(dofs_[2][ep_dof_offset + j]);
          edge_dof_offset++;
        }
      }
      // Set indices for interior edge degrees of freedom
      for (unsigned j = 0; j < no_int_dof_edge; j++) {
        dofs_[1].push_back(dof_idx);
        edge_dof_offset++;
        dof_entities_.push_back(edge);
        dof_idx++;
      }
    }
    // Set sentinel
    offsets_[1][no_edges] = edge_dof_offset;

    // Step III: Set indices for shape functions on cells (co-dimension = 0)
    const size_type no_cells = mesh_p_->NumEntities(0);
    // Set length of cell-related index vectors
    num_int_dofs_[0].resize(no_cells, 0);
    offsets_[0].resize(no_cells + 1, 0);
    // points to the position of the current dof index
    size_type cell_dof_offset = 0;
    for (glb_idx_t cell_idx = 0; cell_idx < no_cells; cell_idx++) {
      // Obtain pointer to current ell
      const mesh::Entity *cell{mesh_p_->EntityByIndex(0, cell_idx)};
      // Offset for indices of cell dof in index vector
      offsets_[0][cell_idx] = cell_dof_offset;
      const size_type no_int_dof_cell = locdof(*cell);
      num_int_dofs_[0][cell_idx] = no_int_dof_cell;

      // Obtain indices for basis functions in vertices
      for (const lf::mesh::Entity *vertex : cell->SubEntities(2)) {
        const glb_idx_t vt_idx(mesh_p_->Index(*vertex));
        const glb_idx_t vt_dof_offset = offsets_[2][vt_idx];
        const size_type no_int_dofs_vt = num_int_dofs_[2][vt_idx];
        // Copy indices of shape functions from nodes to cell
        for (unsigned j = 0; j < no_int_dofs_vt; j++) {
          dofs_[0].push_back(dofs_[2][vt_dof_offset + j]);
          cell_dof_offset++;
        }
      }

      // Collect indices of interior shape functions of edges
      // Internal ordering will depend on the orientation of the edge
      auto edge_orientations = cell->RelativeOrientations();
      auto edges = cell->SubEntities(1);
      // Loop over edges
      for (int ed_sub_idx = 0; ed_sub_idx < cell->RefEl().NumSubEntities(1);
           ed_sub_idx++) {
        const glb_idx_t edge_idx = mesh_p_->Index(*edges[ed_sub_idx]);
        const size_type no_int_dof_edge = num_int_dofs_[1][edge_idx];
        const glb_idx_t edge_int_dof_offset =
            offsets_[1][edge_idx + 1] - no_int_dof_edge;

        // Copy indices of shape functions from edges to cell
        // The order, in which they are copied depends on the relative
        // orientation of the edge w.r.t. the cell
        switch (edge_orientations[ed_sub_idx]) {
          case lf::mesh::Orientation::positive: {
            for (int j = 0; j < no_int_dof_edge; j++) {
              dofs_[0].push_back(dofs_[1][edge_int_dof_offset + j]);
              cell_dof_offset++;
            }
            break;
          }
          case lf::mesh::Orientation::negative: {
            for (int j = static_cast<int>(no_int_dof_edge - 1); j >= 0; j--) {
              dofs_[0].push_back(dofs_[1][edge_int_dof_offset + j]);
              cell_dof_offset++;
            }
            break;
          }
        }  // end switch
      }  // end loop over edges

      // Set indices for interior shape functions of the cell
      for (unsigned j = 0; j < no_int_dof_cell; j++) {
        dofs_[0].push_back(dof_idx);
        cell_dof_offset++;
        dof_entities_.push_back(cell);
        dof_idx++;
      }  // end loop over interior dof of cell
    }  // end loop over cells
    // Set sentinel
    offsets_[0][no_cells] = cell_dof_offset;

    // Finally set number of global shape functions
    num_dof_ = dof_idx;
  }